

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void handleSelectionRequest(XEvent *event)

{
  long in_RDI;
  XEvent reply;
  XSelectionRequestEvent *request;
  XEvent local_d0;
  long local_10;
  
  local_10 = in_RDI;
  memset(&local_d0,0,0xc0);
  local_d0.type = 0x1f;
  local_d0.xselectionrequest.target = writeTargetToProperty((XSelectionRequestEvent *)reply.pad[0]);
  local_d0.xany.display = (Display *)*(undefined8 *)(local_10 + 0x18);
  local_d0.xany.window = *(Window *)(local_10 + 0x28);
  local_d0.xkey.root = *(Window *)(local_10 + 0x30);
  local_d0.xkey.subwindow = *(Window *)(local_10 + 0x38);
  local_d0.xselectionrequest.property = *(Atom *)(local_10 + 0x48);
  (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,*(Window *)(local_10 + 0x28),0,0,&local_d0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}